

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O3

void get_progress(void *coder_ptr,uint64_t *progress_in,uint64_t *progress_out)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)((long)coder_ptr + 0x168));
  if (iVar2 == 0) {
    *progress_in = *(uint64_t *)((long)coder_ptr + 0x158);
    *progress_out = *(uint64_t *)((long)coder_ptr + 0x160);
    if (*(int *)((long)coder_ptr + 0x144) != 0) {
      lVar4 = 0x160;
      uVar3 = 0;
      do {
        iVar2 = pthread_mutex_lock((pthread_mutex_t *)(*(long *)((long)coder_ptr + 0x138) + lVar4));
        if (iVar2 != 0) goto LAB_007be47d;
        lVar1 = *(long *)((long)coder_ptr + 0x138);
        *progress_in = *progress_in + *(long *)(lVar1 + -0x130 + lVar4);
        *progress_out = *progress_out + *(long *)(lVar1 + -0x128 + lVar4);
        iVar2 = pthread_mutex_unlock((pthread_mutex_t *)(lVar1 + lVar4));
        if (iVar2 != 0) goto LAB_007be49c;
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x1c0;
      } while (uVar3 < *(uint *)((long)coder_ptr + 0x144));
    }
    iVar2 = pthread_mutex_unlock((pthread_mutex_t *)((long)coder_ptr + 0x168));
    if (iVar2 == 0) {
      return;
    }
LAB_007be49c:
    __assert_fail("ret == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                  ,0xcc,"void mythread_mutex_unlock(mythread_mutex *)");
  }
LAB_007be47d:
  __assert_fail("ret == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                ,0xc4,"void mythread_mutex_lock(mythread_mutex *)");
}

Assistant:

static void
get_progress(void *coder_ptr, uint64_t *progress_in, uint64_t *progress_out)
{
	lzma_stream_coder *coder = coder_ptr;

	// Lock coder->mutex to prevent finishing threads from moving their
	// progress info from the worker_thread structure to lzma_stream_coder.
	mythread_sync(coder->mutex) {
		*progress_in = coder->progress_in;
		*progress_out = coder->progress_out;

		for (size_t i = 0; i < coder->threads_initialized; ++i) {
			mythread_sync(coder->threads[i].mutex) {
				*progress_in += coder->threads[i].progress_in;
				*progress_out += coder->threads[i]
						.progress_out;
			}
		}
	}